

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall
QtPrivate::QCalendarView::mouseDoubleClickEvent(QCalendarView *this,QMouseEvent *event)

{
  int iVar1;
  QAbstractItemModel *object;
  QCalendarModel *pQVar2;
  QDate QVar3;
  QStyle *pQVar4;
  
  object = QAbstractItemView::model((QAbstractItemView *)this);
  pQVar2 = qobject_cast_helper<QtPrivate::QCalendarModel*,QObject>((QObject *)object);
  if (pQVar2 == (QCalendarModel *)0x0) {
    QAbstractItemView::mouseDoubleClickEvent((QAbstractItemView *)this,event);
    return;
  }
  if (this->readOnly == false) {
    QVar3 = handleMouseEvent(this,event);
    this->validDateClicked = false;
    if (QVar3.jd == (pQVar2->m_date).jd) {
      pQVar4 = QWidget::style((QWidget *)this);
      iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x3d,0,this,0);
      if (iVar1 == 0) {
        editingFinished(this);
        return;
      }
    }
  }
  return;
}

Assistant:

void QCalendarView::mouseDoubleClickEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseDoubleClickEvent(event);
        return;
    }

    if (readOnly)
        return;

    QDate date = handleMouseEvent(event);
    validDateClicked = false;
    if (date == calendarModel->m_date &&
        !style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this)) {
        emit editingFinished();
    }
}